

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resupply_Cancel_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Resupply_Cancel_PDU::Resupply_Cancel_PDU
          (Resupply_Cancel_PDU *this,EntityIdentifier *ReceivingEntity,
          EntityIdentifier *SupplyingEntity)

{
  EntityIdentifier *SupplyingEntity_local;
  EntityIdentifier *ReceivingEntity_local;
  Resupply_Cancel_PDU *this_local;
  
  Logistics_Header::Logistics_Header(&this->super_Logistics_Header);
  (this->super_Logistics_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Resupply_Cancel_PDU_0032e728;
  (this->super_Logistics_Header).super_Header.super_Header6.m_ui8PDUType = '\b';
  (this->super_Logistics_Header).super_Header.super_Header6.m_ui16PDULength = 0x18;
  DATA_TYPE::EntityIdentifier::operator=
            (&(this->super_Logistics_Header).m_ReceivingEntity,ReceivingEntity);
  DATA_TYPE::EntityIdentifier::operator=
            (&(this->super_Logistics_Header).m_SupplyingEntity,SupplyingEntity);
  return;
}

Assistant:

Resupply_Cancel_PDU::Resupply_Cancel_PDU( const EntityIdentifier & ReceivingEntity, const EntityIdentifier & SupplyingEntity )
{
    m_ui8PDUType = Resupply_Cancel_PDU_Type;
    m_ui16PDULength = RESUPPLY_CANCEL_PDU_SIZE;
    m_ReceivingEntity = ReceivingEntity;
    m_SupplyingEntity = SupplyingEntity;
}